

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQInstance *i,SQInteger memsize)

{
  SQClass *pSVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr *this_00;
  SQObjectPtr *o;
  bool bVar3;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_001364e0;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this_00 = this->_values;
  this->_memsize = memsize;
  pSVar1 = i->_class;
  this->_class = pSVar1;
  SVar2 = (pSVar1->_defaultvalues)._size;
  o = i->_values;
  while (bVar3 = SVar2 != 0, SVar2 = SVar2 - 1, bVar3) {
    SQObjectPtr::SQObjectPtr(this_00,o);
    this_00 = this_00 + 1;
    o = o + 1;
  }
  Init(this,ss);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQInstance *i, SQInteger memsize)
{
    _memsize = memsize;
    _class = i->_class;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(i->_values[n]);
    }
    Init(ss);
}